

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_EnumerateCallbackResult
enumerateFromMountPoint
          (DirHandle *i,char *arcfname,PHYSFS_EnumerateCallback callback,char *_fname,void *data)

{
  char *pcVar1;
  PHYSFS_EnumerateCallback p_Var2;
  void *pvVar3;
  PHYSFS_EnumerateCallbackResult PVar4;
  size_t sVar5;
  size_t sVar6;
  ulong *puVar7;
  char *pcVar8;
  long lVar9;
  PHYSFS_EnumerateCallback *pp_Var10;
  PHYSFS_ErrorCode errcode;
  bool bVar11;
  PHYSFS_EnumerateCallback local_48;
  char *local_40;
  void *local_38;
  
  pp_Var10 = &local_48;
  local_48 = callback;
  local_40 = _fname;
  local_38 = data;
  sVar5 = strlen(arcfname);
  sVar6 = strlen(i->mountPoint);
  if (sVar6 + 1 < 0x100) {
    pp_Var10 = (PHYSFS_EnumerateCallback *)((long)&local_48 - (sVar6 + 0x18 & 0xfffffffffffffff0));
    puVar7 = (ulong *)pp_Var10;
  }
  else {
    puVar7 = (ulong *)0x0;
  }
  bVar11 = puVar7 == (ulong *)0x0;
  if (bVar11) {
    pp_Var10[-1] = (PHYSFS_EnumerateCallback)0x108cf8;
    puVar7 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar6 + 9);
  }
  if (puVar7 == (ulong *)0x0) {
    puVar7 = (ulong *)0x0;
  }
  else {
    *puVar7 = (ulong)bVar11;
    puVar7 = puVar7 + 1;
  }
  if (puVar7 == (ulong *)0x0) {
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  else {
    pcVar1 = i->mountPoint;
    pp_Var10[-1] = (PHYSFS_EnumerateCallback)0x108d21;
    strcpy((char *)puVar7,pcVar1);
    lVar9 = sVar5 + 1;
    if (sVar5 == 0) {
      lVar9 = 0;
    }
    pp_Var10[-1] = (PHYSFS_EnumerateCallback)0x108d3c;
    pcVar8 = strchr((char *)(lVar9 + (long)puVar7),0x2f);
    pvVar3 = local_38;
    pcVar1 = local_40;
    p_Var2 = local_48;
    if (pcVar8 == (char *)0x0) {
      pp_Var10[-1] = verifyPath;
      __assert_fail("end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs.c"
                    ,0x926,
                    "PHYSFS_EnumerateCallbackResult enumerateFromMountPoint(DirHandle *, const char *, PHYSFS_EnumerateCallback, const char *, void *)"
                   );
    }
    *pcVar8 = '\0';
    pp_Var10[-1] = (PHYSFS_EnumerateCallback)0x108d52;
    PVar4 = (*p_Var2)(pvVar3,pcVar1,(char *)(lVar9 + (long)puVar7));
    if (puVar7[-1] != 0) {
      pp_Var10[-1] = (PHYSFS_EnumerateCallback)0x108d69;
      (*__PHYSFS_AllocatorHooks.Free)(puVar7 + -1);
    }
    if (PVar4 != PHYSFS_ENUM_ERROR) {
      return PVar4;
    }
    errcode = PHYSFS_ERR_APP_CALLBACK;
  }
  pp_Var10[-1] = (PHYSFS_EnumerateCallback)0x108d7f;
  PHYSFS_setErrorCode(errcode);
  return PHYSFS_ENUM_ERROR;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumerateFromMountPoint(DirHandle *i,
                                    const char *arcfname,
                                    PHYSFS_EnumerateCallback callback,
                                    const char *_fname, void *data)
{
    PHYSFS_EnumerateCallbackResult retval;
    const size_t len = strlen(arcfname);
    char *ptr = NULL;
    char *end = NULL;
    const size_t slen = strlen(i->mountPoint) + 1;
    char *mountPoint = (char *) __PHYSFS_smallAlloc(slen);

    BAIL_IF(!mountPoint, PHYSFS_ERR_OUT_OF_MEMORY, PHYSFS_ENUM_ERROR);

    strcpy(mountPoint, i->mountPoint);
    ptr = mountPoint + ((len) ? len + 1 : 0);
    end = strchr(ptr, '/');
    assert(end);  /* should always find a terminating '/'. */
    *end = '\0';
    retval = callback(data, _fname, ptr);
    __PHYSFS_smallFree(mountPoint);

    BAIL_IF(retval == PHYSFS_ENUM_ERROR, PHYSFS_ERR_APP_CALLBACK, retval);
    return retval;
}